

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
list_caster<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_PerfectMatch>::load
          (list_caster<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_PerfectMatch> *this
          ,handle src,bool convert)

{
  pointer pPVar1;
  bool bVar2;
  bool bVar3;
  itype *__x;
  long lVar4;
  sequence_iterator sVar5;
  sequence s;
  reference it;
  value_conv conv;
  handle local_90;
  handle local_88;
  handle local_80;
  PyObject *local_78;
  long local_70;
  PyObject *local_60;
  long local_58;
  object local_50;
  type_caster_generic local_48;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr == (PyObject *)0x0) {
      local_90.m_ptr = (PyObject *)0x0;
    }
    else {
      if (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0) goto LAB_0019aae2;
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      local_90.m_ptr = src.m_ptr;
    }
    pPVar1 = (this->value).super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->value).super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar1) {
      (this->value).super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar1;
    }
    if (local_90.m_ptr != (PyObject *)0x0) {
      (local_90.m_ptr)->ob_refcnt = (local_90.m_ptr)->ob_refcnt + 1;
    }
    local_80.m_ptr = local_90.m_ptr;
    reserve_maybe<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_0>
              (this,(sequence *)&local_80,&this->value);
    object::~object((object *)&local_80);
    local_78 = local_90.m_ptr;
    sVar5 = sequence::end((sequence *)&local_90);
    local_70 = sVar5.super_sequence_slow_readwrite.index;
    for (lVar4 = 0; bVar2 = local_70 == lVar4, !bVar2; lVar4 = lVar4 + 1) {
      local_60 = local_78;
      local_50.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_58 = lVar4;
      type_caster_base<PerfectMatch>::type_caster_base((type_caster_base<PerfectMatch> *)&local_48);
      accessor::operator_cast_to_object((accessor *)&local_88);
      bVar3 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                        (&local_48,local_88,convert);
      object::~object((object *)&local_88);
      if (!bVar3) {
        object::~object(&local_50);
        break;
      }
      __x = detail::type_caster_base::operator_cast_to_PerfectMatch_((type_caster_base *)&local_48);
      std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::push_back(&this->value,__x);
      object::~object(&local_50);
    }
    object::~object((object *)&local_90);
  }
  else {
LAB_0019aae2:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }